

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

bool absl::lts_20250127::time_internal::cctz::detail::operator<
               (civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *lhs,
               civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *rhs)

{
  int iVar1;
  int iVar2;
  year_t yVar3;
  year_t yVar4;
  undefined1 local_71;
  undefined1 local_69;
  undefined1 local_61;
  undefined1 local_59;
  undefined1 local_51;
  undefined1 local_49;
  undefined1 local_41;
  undefined1 local_39;
  undefined1 local_29;
  undefined1 local_19;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *rhs_local;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *lhs_local;
  
  yVar3 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year(lhs);
  yVar4 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year(rhs);
  local_19 = true;
  if (yVar4 <= yVar3) {
    yVar3 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year(lhs);
    yVar4 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year(rhs);
    local_29 = false;
    if (yVar3 == yVar4) {
      iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::month(lhs);
      iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::month(rhs);
      local_39 = true;
      if (iVar2 <= iVar1) {
        iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::month(lhs);
        iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::month(rhs);
        local_41 = false;
        if (iVar1 == iVar2) {
          iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::day(lhs);
          iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::day(rhs);
          local_49 = true;
          if (iVar2 <= iVar1) {
            iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::day
                              (lhs);
            iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::day
                              (rhs);
            local_51 = false;
            if (iVar1 == iVar2) {
              iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::hour
                                (lhs);
              iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::hour
                                (rhs);
              local_59 = true;
              if (iVar2 <= iVar1) {
                iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::
                        hour(lhs);
                iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::
                        hour(rhs);
                local_61 = false;
                if (iVar1 == iVar2) {
                  iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::
                          minute(lhs);
                  iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::
                          minute(rhs);
                  local_69 = true;
                  if (iVar2 <= iVar1) {
                    iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                            ::minute(lhs);
                    iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                            ::minute(rhs);
                    local_71 = false;
                    if (iVar1 == iVar2) {
                      iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                              ::second(lhs);
                      iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                              ::second(rhs);
                      local_71 = iVar1 < iVar2;
                    }
                    local_69 = local_71;
                  }
                  local_61 = local_69;
                }
                local_59 = local_61;
              }
              local_51 = local_59;
            }
            local_49 = local_51;
          }
          local_41 = local_49;
        }
        local_39 = local_41;
      }
      local_29 = local_39;
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

CONSTEXPR_F bool operator<(const civil_time<T1>& lhs,
                           const civil_time<T2>& rhs) noexcept {
  return (
      lhs.year() < rhs.year() ||
      (lhs.year() == rhs.year() &&
       (lhs.month() < rhs.month() ||
        (lhs.month() == rhs.month() &&
         (lhs.day() < rhs.day() || (lhs.day() == rhs.day() &&
                                    (lhs.hour() < rhs.hour() ||
                                     (lhs.hour() == rhs.hour() &&
                                      (lhs.minute() < rhs.minute() ||
                                       (lhs.minute() == rhs.minute() &&
                                        (lhs.second() < rhs.second())))))))))));
}